

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

String __thiscall MiniScript::String::Format(String *this,int num,char *formatSpec)

{
  undefined8 extraout_RDX;
  String SVar1;
  char local_48 [8];
  char buf [32];
  char *formatSpec_local;
  int num_local;
  
  snprintf(local_48,0x20,formatSpec,(ulong)(uint)num);
  String(this,local_48);
  SVar1._8_8_ = extraout_RDX;
  SVar1.ss = (StringStorage *)this;
  return SVar1;
}

Assistant:

String String::Format(int num, const char* formatSpec) {
		char buf[32];
		snprintf(buf, 32, formatSpec, num);
		return buf;
	}